

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_except.cc
# Opt level: O3

void init_except(module *m)

{
  PyObject *in_RAX;
  handle local_18;
  module_ except_m;
  
  local_18.m_ptr = in_RAX;
  pybind11::module_::def_submodule((module_ *)&local_18,(char *)m,"exception");
  pybind11::detail::register_exception_impl<kratos::VarException>
            (local_18,"VarException",_PyExc_Exception,false);
  pybind11::detail::register_exception_impl<kratos::StmtException>
            (local_18,"StmtException",_PyExc_Exception,false);
  pybind11::detail::register_exception_impl<kratos::InternalException>
            (local_18,"InternalException",_PyExc_Exception,false);
  pybind11::detail::register_exception_impl<kratos::UserException>
            (local_18,"UserException",_PyExc_Exception,false);
  pybind11::detail::register_exception_impl<kratos::InvalidConversionException>
            (local_18,"InvalidConversionException",_PyExc_Exception,false);
  pybind11::object::~object((object *)&local_18);
  return;
}

Assistant:

void init_except(py::module &m) {
    using namespace kratos;
    auto except_m = m.def_submodule("exception");
    py::register_exception<VarException>(except_m, "VarException");
    py::register_exception<StmtException>(except_m, "StmtException");
    py::register_exception<InternalException>(except_m, "InternalException");
    py::register_exception<UserException>(except_m, "UserException");
    py::register_exception<InvalidConversionException>(except_m, "InvalidConversionException");
}